

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SameKeyResume_Test::TestBody
          (SSLVersionTest_SameKeyResume_Test *this)

{
  pointer pcVar1;
  int iVar2;
  pointer *__ptr;
  char *in_R9;
  char *pcVar3;
  pointer *__ptr_2;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  UniquePtr<SSL_CTX> server_ctx2;
  uint8_t key [48];
  Message local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  AssertHelper local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> local_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Head_base<0UL,_ssl_st_*,_false> local_d0;
  _Head_base<0UL,_ssl_st_*,_false> local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  _Head_base<0UL,_x509_st_*,_false> _Stack_80;
  undefined1 local_78 [32];
  uchar local_58 [56];
  
  RAND_bytes(local_58,0x30);
  SSLVersionTest::CreateContext((SSLVersionTest *)local_c0);
  local_f0[0] = (internal)
                ((_Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>)local_c0 !=
                (ssl_ctx_st *)0x0);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((_Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>)local_c0 == (ssl_ctx_st *)0x0) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_f0,(AssertionResult *)"server_ctx2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x208d,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,&local_118);
  }
  else {
    local_f0[0] = (internal)
                  SSLVersionTest::UseCertAndKey(&this->super_SSLVersionTest,(SSL_CTX *)local_c0);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_f0[0]) {
      iVar2 = SSL_CTX_set_tlsext_ticket_keys
                        ((this->super_SSLVersionTest).server_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,local_58,0x30);
      local_f0[0] = (internal)(iVar2 != 0);
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message(&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)local_f0,
                   (AssertionResult *)
                   "SSL_CTX_set_tlsext_ticket_keys(server_ctx_.get(), key, sizeof(key))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2090,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,&local_118);
      }
      else {
        iVar2 = SSL_CTX_set_tlsext_ticket_keys((SSL_CTX *)local_c0,local_58,0x30);
        local_f0[0] = (internal)(iVar2 != 0);
        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_f0[0]) {
          SSL_CTX_set_session_cache_mode
                    ((this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          SSL_CTX_set_session_cache_mode
                    ((this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          SSL_CTX_set_session_cache_mode((SSL_CTX *)local_c0,3);
          pcVar1 = local_a8 + 0x10;
          local_a8._8_8_ = (ssl_st *)0x0;
          aStack_90._0_8_ = (ssl_ctx_st *)0x0;
          _Stack_80._M_head_impl = (x509_st *)0x0;
          local_78._8_8_ = 0;
          local_b8._0_8_ = (GTestFlagSaver *)0x0;
          local_b8._8_8_ = (_func_int **)0x0;
          local_a8._16_8_ = (ssl_st *)0x0;
          local_78._0_8_ = (evp_pkey_st *)0x0;
          local_78._16_8_ = 0;
          local_a8._0_8_ = pcVar1;
          aStack_90._8_8_ = local_78;
          CreateClientSession((anon_unknown_0 *)&local_f8,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (this->super_SSLVersionTest).server_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (ClientConfig *)local_b8);
          if ((undefined1 *)aStack_90._8_8_ != local_78) {
            operator_delete((void *)aStack_90._8_8_,(ulong)(local_78._0_8_ + 1));
          }
          if ((pointer)local_a8._0_8_ != pcVar1) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
          }
          local_f0[0] = (internal)
                        ((tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                          )local_f8._M_head_impl !=
                        (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0);
          local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )local_f8._M_head_impl ==
              (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
            testing::Message::Message(&local_118);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b8,(internal *)local_f0,(AssertionResult *)0x34e814,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x209b,(char *)local_b8._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,&local_118);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
            if ((undefined1 *)local_b8._0_8_ != local_a8) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
            }
            if ((long *)CONCAT71(local_118.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_118.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_118.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_118.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
            if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_e8,local_e8);
            }
          }
          else {
            local_b8._8_8_ = (_func_int **)0x0;
            local_a8._8_8_ = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
            _Stack_80._M_head_impl = (x509_st *)0x0;
            local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
            local_78._16_8_ = local_78._16_8_ & 0xffffff0000000000;
            local_b8._0_8_ = local_f8._M_head_impl;
            local_d0._M_head_impl = (SSL *)0x0;
            local_c8._M_head_impl = (SSL *)0x0;
            pcVar3 = (char *)0x1;
            local_a8._0_8_ = pcVar1;
            aStack_90._8_8_ = local_78;
            local_118.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ =
                 (internal)
                 ConnectClientAndServer
                           ((UniquePtr<SSL> *)&local_d0,(UniquePtr<SSL> *)&local_c8,
                            (this->super_SSLVersionTest).client_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (this->super_SSLVersionTest).server_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (ClientConfig *)local_b8,true);
            local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_118.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._0_1_) {
              iVar2 = SSL_session_reused(local_d0._M_head_impl);
              local_118.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_100);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)&local_118,
                           (AssertionResult *)"SSL_session_reused(client.get())","false","true",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a3,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                testing::internal::AssertHelper::~AssertHelper(&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                  local_e0._M_allocated_capacity + 1);
                }
                if (local_100._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_100._M_head_impl + 8))();
                }
                if (local_110 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_110,local_110);
                }
              }
              iVar2 = SSL_session_reused(local_c8._M_head_impl);
              local_118.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_100);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)&local_118,
                           (AssertionResult *)"SSL_session_reused(server.get())","false","true",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a4,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                testing::internal::AssertHelper::~AssertHelper(&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                  local_e0._M_allocated_capacity + 1);
                }
                if (local_100._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_100._M_head_impl + 8))();
                }
                if (local_110 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_110,local_110);
                }
              }
              pcVar3 = (char *)0x1;
              local_118.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ =
                   (internal)
                   ConnectClientAndServer
                             ((UniquePtr<SSL> *)&local_d0,(UniquePtr<SSL> *)&local_c8,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (SSL_CTX *)local_c0,(ClientConfig *)local_b8,true);
              local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_100);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)&local_118,
                           (AssertionResult *)
                           "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx2.get(), config)"
                           ,"false","true",pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a8,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                goto LAB_001c8cae;
              }
              iVar2 = SSL_session_reused(local_d0._M_head_impl);
              local_118.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_100);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)&local_118,
                           (AssertionResult *)"SSL_session_reused(client.get())","false","true",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20a9,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                testing::internal::AssertHelper::~AssertHelper(&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                  local_e0._M_allocated_capacity + 1);
                }
                if (local_100._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_100._M_head_impl + 8))();
                }
                if (local_110 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_110,local_110);
                }
              }
              iVar2 = SSL_session_reused(local_c8._M_head_impl);
              local_118.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_118.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_100);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)&local_118,
                           (AssertionResult *)"SSL_session_reused(server.get())","false","true",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_108,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20aa,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
                testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
                goto LAB_001c8cae;
              }
            }
            else {
              testing::Message::Message((Message *)&local_100);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f0,(internal *)&local_118,
                         (AssertionResult *)
                         "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx_.get(), config)"
                         ,"false","true",pcVar3);
              testing::internal::AssertHelper::AssertHelper
                        (&local_108,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x20a2,(char *)CONCAT71(local_f0._1_7_,local_f0[0]));
              testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
LAB_001c8cae:
              testing::internal::AssertHelper::~AssertHelper(&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_f0._1_7_,local_f0[0]),
                                local_e0._M_allocated_capacity + 1);
              }
              if (local_100._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_100._M_head_impl + 8))();
              }
              if (local_110 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_110,local_110);
              }
            }
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_c8);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_d0);
            if ((undefined1 *)aStack_90._8_8_ != local_78) {
              operator_delete((void *)aStack_90._8_8_,(ulong)(local_78._0_8_ + 1));
            }
            if ((pointer)local_a8._0_8_ != pcVar1) {
              operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
            }
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_f8);
          goto LAB_001c8b26;
        }
        testing::Message::Message(&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)local_f0,
                   (AssertionResult *)
                   "SSL_CTX_set_tlsext_ticket_keys(server_ctx2.get(), key, sizeof(key))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2092,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,&local_118);
      }
    }
    else {
      testing::Message::Message(&local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)local_f0,
                 (AssertionResult *)"UseCertAndKey(server_ctx2.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x208e,(char *)local_b8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,&local_118);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
  if ((GTestFlagSaver *)local_b8._0_8_ != (GTestFlagSaver *)local_a8) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
  }
  if ((long *)CONCAT71(local_118.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_118.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_118.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_118.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
LAB_001c8b26:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)local_c0);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SameKeyResume) {
  uint8_t key[48];
  RAND_bytes(key, sizeof(key));

  bssl::UniquePtr<SSL_CTX> server_ctx2 = CreateContext();
  ASSERT_TRUE(server_ctx2);
  ASSERT_TRUE(UseCertAndKey(server_ctx2.get()));
  ASSERT_TRUE(
      SSL_CTX_set_tlsext_ticket_keys(server_ctx_.get(), key, sizeof(key)));
  ASSERT_TRUE(
      SSL_CTX_set_tlsext_ticket_keys(server_ctx2.get(), key, sizeof(key)));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx2.get(), SSL_SESS_CACHE_BOTH);

  // Establish a session for |server_ctx_|.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);
  ClientConfig config;
  config.session = session.get();

  // Resuming with |server_ctx_| again works.
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                     server_ctx_.get(), config));
  EXPECT_TRUE(SSL_session_reused(client.get()));
  EXPECT_TRUE(SSL_session_reused(server.get()));

  // Resuming with |server_ctx2| also works.
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                     server_ctx2.get(), config));
  EXPECT_TRUE(SSL_session_reused(client.get()));
  EXPECT_TRUE(SSL_session_reused(server.get()));
}